

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint readChunk_iTXt(LodePNGInfo *info,LodePNGDecoderSettings *decoder,uchar *data,size_t chunkLength
                   )

{
  uchar uVar1;
  int iVar2;
  char *key;
  char *langtag;
  char *transkey;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  size_t __n;
  uint uVar6;
  uint uVar7;
  size_t size_00;
  bool bVar8;
  uchar *str;
  size_t size;
  LodePNGDecompressSettings zlibsettings;
  uchar *local_68;
  size_t local_60;
  LodePNGDecompressSettings local_58;
  
  local_58.custom_context = (decoder->zlibsettings).custom_context;
  local_58.ignore_adler32 = (decoder->zlibsettings).ignore_adler32;
  local_58.ignore_nlen = (decoder->zlibsettings).ignore_nlen;
  local_58.max_output_size = (decoder->zlibsettings).max_output_size;
  local_58.custom_zlib = (decoder->zlibsettings).custom_zlib;
  local_58.custom_inflate = (decoder->zlibsettings).custom_inflate;
  if (chunkLength < 5) {
    uVar6 = 0x1e;
  }
  else {
    __n = 0;
    uVar3 = 1;
    do {
      uVar6 = (uint)uVar3;
      if (data[__n] == '\0') break;
      uVar6 = uVar6 + 1;
      bVar8 = uVar3 < chunkLength;
      __n = uVar3;
      uVar3 = (ulong)uVar6;
    } while (bVar8);
    uVar7 = uVar6 - 1;
    uVar3 = (ulong)(uVar6 + 2);
    if (uVar3 < chunkLength) {
      if (0xffffffb0 < uVar6 - 0x51) {
        key = (char *)malloc((ulong)uVar7 + 1);
        if (key == (char *)0x0) {
          key = (char *)0x0;
        }
        else {
          if (uVar7 != 0) {
            memcpy(key,data,__n);
          }
          key[__n] = '\0';
          transkey = (char *)0x0;
          if (data[__n + 2] != '\0') {
            uVar6 = 0x48;
            langtag = (char *)0x0;
            goto LAB_0011cee3;
          }
          if (uVar3 < chunkLength) {
            transkey = (char *)0x0;
            uVar4 = uVar3;
            do {
              if (data[uVar4] == '\0') break;
              uVar4 = (ulong)(uVar6 + 3 + (int)transkey);
              transkey = (char *)(ulong)((int)transkey + 1);
            } while (uVar4 < chunkLength);
          }
          uVar1 = data[(ulong)uVar7 + 1];
          iVar2 = (int)transkey;
          langtag = (char *)malloc((ulong)(iVar2 + 1U));
          if (langtag != (char *)0x0) {
            if (iVar2 != 0) {
              memcpy(langtag,data + uVar3,(size_t)transkey);
            }
            langtag[(long)transkey] = '\0';
            uVar6 = iVar2 + 1U + uVar6 + 2;
            uVar3 = (ulong)uVar6;
            uVar5 = 0;
            if (uVar3 < chunkLength) {
              uVar5 = 0;
              uVar4 = uVar3;
              do {
                if (data[uVar4] == '\0') break;
                uVar4 = (ulong)(iVar2 + uVar7 + 5 + uVar5);
                uVar5 = uVar5 + 1;
              } while (uVar4 < chunkLength);
            }
            transkey = (char *)malloc((ulong)(uVar5 + 1));
            if (transkey == (char *)0x0) {
              transkey = (char *)0x0;
              uVar6 = 0x53;
            }
            else {
              if (uVar5 != 0) {
                memcpy(transkey,data + uVar3,(ulong)uVar5);
              }
              transkey[uVar5] = '\0';
              uVar6 = uVar5 + 1 + uVar6;
              size_00 = (size_t)((uint)chunkLength - uVar6);
              if ((uint)chunkLength < uVar6) {
                size_00 = 0;
              }
              if (uVar1 == '\0') {
                uVar6 = lodepng_add_itext_sized
                                  (info,key,langtag,transkey,(char *)(data + uVar6),size_00);
              }
              else {
                local_68 = (uchar *)0x0;
                local_60 = 0;
                local_58.max_output_size = decoder->max_text_size;
                uVar7 = zlib_decompress(&local_68,&local_60,0,data + uVar6,size_00,&local_58);
                uVar6 = 0x70;
                if (local_60 <= local_58.max_output_size) {
                  uVar6 = uVar7;
                }
                if (uVar7 == 0) {
                  uVar6 = uVar7;
                }
                if (uVar6 == 0) {
                  uVar6 = lodepng_add_itext_sized
                                    (info,key,langtag,transkey,(char *)local_68,local_60);
                }
                free(local_68);
              }
            }
            goto LAB_0011cee3;
          }
        }
        transkey = (char *)0x0;
        langtag = (char *)0x0;
        uVar6 = 0x53;
        goto LAB_0011cee3;
      }
      uVar6 = 0x59;
    }
    else {
      uVar6 = 0x4b;
    }
  }
  key = (char *)0x0;
  langtag = (char *)0x0;
  transkey = (char *)0x0;
LAB_0011cee3:
  free(key);
  free(langtag);
  free(transkey);
  return uVar6;
}

Assistant:

static unsigned readChunk_iTXt(LodePNGInfo* info, const LodePNGDecoderSettings* decoder,
                               const unsigned char* data, size_t chunkLength) {
  unsigned error = 0;
  unsigned i;

  /*copy the object to change parameters in it*/
  LodePNGDecompressSettings zlibsettings = decoder->zlibsettings;

  unsigned length, begin, compressed;
  char *key = 0, *langtag = 0, *transkey = 0;

  while(!error) /*not really a while loop, only used to break on error*/ {
    /*Quick check if the chunk length isn't too small. Even without check
    it'd still fail with other error checks below if it's too short. This just gives a different error code.*/
    if(chunkLength < 5) CERROR_BREAK(error, 30); /*iTXt chunk too short*/

    /*read the key*/
    for(length = 0; length < chunkLength && data[length] != 0; ++length) ;
    if(length + 3 >= chunkLength) CERROR_BREAK(error, 75); /*no null termination char, corrupt?*/
    if(length < 1 || length > 79) CERROR_BREAK(error, 89); /*keyword too short or long*/

    key = (char*)lodepng_malloc(length + 1);
    if(!key) CERROR_BREAK(error, 83); /*alloc fail*/

    lodepng_memcpy(key, data, length);
    key[length] = 0;

    /*read the compression method*/
    compressed = data[length + 1];
    if(data[length + 2] != 0) CERROR_BREAK(error, 72); /*the 0 byte indicating compression must be 0*/

    /*even though it's not allowed by the standard, no error is thrown if
    there's no null termination char, if the text is empty for the next 3 texts*/

    /*read the langtag*/
    begin = length + 3;
    length = 0;
    for(i = begin; i < chunkLength && data[i] != 0; ++i) ++length;

    langtag = (char*)lodepng_malloc(length + 1);
    if(!langtag) CERROR_BREAK(error, 83); /*alloc fail*/

    lodepng_memcpy(langtag, data + begin, length);
    langtag[length] = 0;

    /*read the transkey*/
    begin += length + 1;
    length = 0;
    for(i = begin; i < chunkLength && data[i] != 0; ++i) ++length;

    transkey = (char*)lodepng_malloc(length + 1);
    if(!transkey) CERROR_BREAK(error, 83); /*alloc fail*/

    lodepng_memcpy(transkey, data + begin, length);
    transkey[length] = 0;

    /*read the actual text*/
    begin += length + 1;

    length = (unsigned)chunkLength < begin ? 0 : (unsigned)chunkLength - begin;

    if(compressed) {
      unsigned char* str = 0;
      size_t size = 0;
      zlibsettings.max_output_size = decoder->max_text_size;
      /*will fail if zlib error, e.g. if length is too small*/
      error = zlib_decompress(&str, &size, 0, &data[begin],
                              length, &zlibsettings);
      /*error: compressed text larger than  decoder->max_text_size*/
      if(error && size > zlibsettings.max_output_size) error = 112;
      if(!error) error = lodepng_add_itext_sized(info, key, langtag, transkey, (char*)str, size);
      lodepng_free(str);
    } else {
      error = lodepng_add_itext_sized(info, key, langtag, transkey, (char*)(data + begin), length);
    }

    break;
  }

  lodepng_free(key);
  lodepng_free(langtag);
  lodepng_free(transkey);

  return error;
}